

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O1

void __thiscall avro::NodeSymbolic::NodeSymbolic(NodeSymbolic *this,HasName *name,NodePtr *n)

{
  sp_counted_base *psVar1;
  
  (this->super_NodeImplSymbolic).super_Node.type_ = AVRO_NUM_TYPES;
  (this->super_NodeImplSymbolic).super_Node.locked_ = false;
  (this->super_NodeImplSymbolic).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_001cdd68;
  concepts::SingleAttribute<avro::Name>::SingleAttribute
            (&(this->super_NodeImplSymbolic).nameAttribute_,name);
  (this->super_NodeImplSymbolic).super_Node._vptr_Node = (_func_int **)&PTR__NodeSymbolic_001cea20;
  (this->actualNode_).px = n->px;
  psVar1 = (n->pn).pi_;
  (this->actualNode_).pn.pi_ = psVar1;
  if (psVar1 != (sp_counted_base *)0x0) {
    LOCK();
    psVar1->weak_count_ = psVar1->weak_count_ + 1;
    UNLOCK();
  }
  return;
}

Assistant:

NodeSymbolic(const HasName &name, const NodePtr n) :
        NodeImplSymbolic(AVRO_SYMBOLIC, name, NoLeaves(), NoLeafNames(), NoSize()), actualNode_(n)
    { }